

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O2

int scaling_list_data(GetBitContext *gb,ScalingList *sl,HEVCSPS *sps)

{
  uint8_t uVar1;
  byte bVar2;
  undefined2 uVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar12 = 0;
  do {
    if (uVar12 == 4) {
      if (sps->chroma_format_idc == 3) {
        for (lVar6 = -0x40; lVar6 != 0; lVar6 = lVar6 + 1) {
          uVar1 = sl->sl[2][3][lVar6];
          sl->sl[3][2][lVar6] = sl->sl[2][2][lVar6];
          sl->sl[3][3][lVar6] = uVar1;
          *(uint8_t *)((long)(sl->sl_dc + -0xb) + lVar6 + 2) = sl->sl[2][5][lVar6];
          sl->sl_dc[0][lVar6] = sl->sl[3][0][lVar6];
        }
        uVar3 = *(undefined2 *)(sl->sl_dc[0] + 4);
        *(undefined2 *)(sl->sl_dc[1] + 1) = *(undefined2 *)(sl->sl_dc[0] + 1);
        *(undefined2 *)(sl->sl_dc[1] + 4) = uVar3;
      }
      return 0;
    }
    uVar7 = 0x10 << ((char)uVar12 * '\x02' & 0x1fU);
    uVar8 = (ulong)uVar7;
    if (0x3f < uVar7) {
      uVar8 = 0x40;
    }
    __n = 0x40;
    if (uVar12 == 0) {
      __n = 0x10;
    }
    for (uVar11 = 0; uVar11 < 6; uVar11 = uVar11 + (ulong)(uVar12 == 3) * 2 + 1) {
      uVar7 = gb->index;
      uVar1 = gb->buffer[uVar7 >> 3];
      gb->index = uVar7 + (uVar7 < gb->size_in_bits_plus8);
      if ((char)(uVar1 << ((byte)uVar7 & 7)) < '\0') {
        uVar10 = 8;
        if (1 < uVar12) {
          iVar4 = get_se_golomb(gb);
          uVar10 = (ulong)(iVar4 + 8U);
          sl->sl_dc[uVar12 - 2][uVar11] = (uint8_t)(iVar4 + 8U);
        }
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          if (uVar12 == 0) {
            lVar6 = (ulong)""[uVar9] << 2;
            puVar5 = "";
          }
          else {
            lVar6 = (ulong)""[uVar9] << 3;
            puVar5 = "";
          }
          bVar2 = puVar5[uVar9];
          iVar4 = get_se_golomb(gb);
          uVar10 = (long)(iVar4 + (int)uVar10 + 0x100) % 0x100 & 0xffffffff;
          sl->sl[uVar12][uVar11][(ulong)bVar2 + lVar6] = (uint8_t)uVar10;
        }
      }
      else {
        uVar7 = get_ue_golomb_long(gb);
        if (uVar7 != 0) {
          if (uVar11 < uVar7) {
            fprintf(_stderr,"Invalid delta in scaling list data: %d.\n",(ulong)uVar7);
            return -1;
          }
          uVar7 = (int)uVar11 - uVar7;
          memcpy(sl->sl[uVar12] + uVar11,sl->sl[uVar12] + uVar7,__n);
          if (1 < uVar12) {
            sl->sl_dc[uVar12 - 2][uVar11] = sl->sl_dc[uVar12 - 2][uVar7];
          }
        }
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static int scaling_list_data(GetBitContext *gb, ScalingList *sl, HEVCSPS *sps)
{
    uint8_t scaling_list_pred_mode_flag;
    int32_t scaling_list_dc_coef[2][6];
    int size_id, matrix_id, pos;
    int i;

    for (size_id = 0; size_id < 4; size_id++)
    {
        for (matrix_id = 0; matrix_id < 6; matrix_id += ((size_id == 3) ? 3 : 1))
        {
            scaling_list_pred_mode_flag = (uint8_t) get_bits1(gb);
            if (!scaling_list_pred_mode_flag)
            {
                unsigned int delta = get_ue_golomb_long(gb);
                /* Only need to handle non-zero delta. Zero means default,
                 * which should already be in the arrays. */
                if (delta)
                {
                    // Copy from previous array.
                    if (matrix_id < delta)
                    {
                        fprintf(stderr, "Invalid delta in scaling list data: %d.\n", delta);
                        return -1;
                    }
                    memcpy(sl->sl[size_id][matrix_id], sl->sl[size_id][matrix_id - delta], size_id > 0 ? 64 : 16);
                    if (size_id > 1)
                        sl->sl_dc[size_id - 2][matrix_id] = sl->sl_dc[size_id - 2][matrix_id - delta];
                }
            }
            else
            {
                int next_coef, coef_num;
                int32_t scaling_list_delta_coef;

                next_coef = 8;
                coef_num = FFMIN(64, 1 << (4 + (size_id << 1)));
                if (size_id > 1)
                {
                    scaling_list_dc_coef[size_id - 2][matrix_id] = get_se_golomb(gb) + 8;
                    next_coef = scaling_list_dc_coef[size_id - 2][matrix_id];
                    sl->sl_dc[size_id - 2][matrix_id] = (uint8_t)next_coef;
                }
                for (i = 0; i < coef_num; i++)
                {
                    if (size_id == 0)
                        pos = 4 * hevc_diag_scan4x4_y[i] + hevc_diag_scan4x4_x[i];
                    else
                        pos = 8 * hevc_diag_scan8x8_y[i] + hevc_diag_scan8x8_x[i];

                    scaling_list_delta_coef = get_se_golomb(gb);
                    next_coef = (next_coef + scaling_list_delta_coef + 256) % 256;
                    sl->sl[size_id][matrix_id][pos] = (uint8_t)next_coef;
                }
            }
        }
    }
    if (sps->chroma_format_idc == 3)
    {
        for (i = 0; i < 64; i++)
        {
            sl->sl[3][1][i] = sl->sl[2][1][i];
            sl->sl[3][2][i] = sl->sl[2][2][i];
            sl->sl[3][4][i] = sl->sl[2][4][i];
            sl->sl[3][5][i] = sl->sl[2][5][i];
        }
        sl->sl_dc[1][1] = sl->sl_dc[0][1];
        sl->sl_dc[1][2] = sl->sl_dc[0][2];
        sl->sl_dc[1][4] = sl->sl_dc[0][4];
        sl->sl_dc[1][5] = sl->sl_dc[0][5];
    }
    return 0;
}